

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(cmCTestCoverageHandlerLocale *this)

{
  bool bVar1;
  string l;
  allocator local_51;
  string local_50;
  string local_30;
  
  (this->lc_all)._M_dataplus._M_p = (pointer)&(this->lc_all).field_2;
  (this->lc_all)._M_string_length = 0;
  (this->lc_all).field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv("LC_ALL",&local_50);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)this);
  }
  bVar1 = std::operator!=(&this->lc_all,"C");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_30,"LC_ALL=C",&local_51);
    cmsys::SystemTools::PutEnv(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

cmCTestCoverageHandlerLocale()
  {
    std::string l;
    if (cmSystemTools::GetEnv("LC_ALL", l)) {
      lc_all = l;
    }
    if (lc_all != "C") {
      cmSystemTools::PutEnv("LC_ALL=C");
    }
  }